

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_mct_validation
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  int iVar2;
  opj_tcp_t *poVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 *pOVar6;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1db0,
                  "OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1db1,
                  "OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1db2,
                  "OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  uVar1 = 1;
  if (((~*(uint *)&p_j2k->m_cp & 0x8200) == 0) &&
     (iVar2 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th, iVar2 != 0)) {
    poVar3 = (p_j2k->m_cp).tcps;
    iVar4 = 0;
    do {
      if (poVar3->mct == 2) {
        if (poVar3->m_mct_coding_matrix == (OPJ_FLOAT32 *)0x0) {
          uVar1 = 0;
        }
        OVar5 = p_j2k->m_private_image->numcomps;
        if (OVar5 != 0) {
          pOVar6 = &poVar3->tccps->qmfbid;
          do {
            uVar1 = ~*pOVar6 & uVar1;
            pOVar6 = pOVar6 + 0x10e;
            OVar5 = OVar5 - 1;
          } while (OVar5 != 0);
        }
      }
      poVar3 = poVar3 + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar2);
  }
  return uVar1;
}

Assistant:

static OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t * p_j2k,
                                       opj_stream_private_t *p_stream,
                                       opj_event_mgr_t * p_manager)
{
    OPJ_BOOL l_is_valid = OPJ_TRUE;
    OPJ_UINT32 i, j;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_stream);
    OPJ_UNUSED(p_manager);

    if ((p_j2k->m_cp.rsiz & 0x8200) == 0x8200) {
        OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
        opj_tcp_t * l_tcp = p_j2k->m_cp.tcps;

        for (i = 0; i < l_nb_tiles; ++i) {
            if (l_tcp->mct == 2) {
                opj_tccp_t * l_tccp = l_tcp->tccps;
                l_is_valid &= (l_tcp->m_mct_coding_matrix != 00);

                for (j = 0; j < p_j2k->m_private_image->numcomps; ++j) {
                    l_is_valid &= !(l_tccp->qmfbid & 1);
                    ++l_tccp;
                }
            }
            ++l_tcp;
        }
    }

    return l_is_valid;
}